

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassSymbols.cpp
# Opt level: O3

Type * __thiscall
slang::ast::GenericClassDefSymbol::getDefaultSpecialization(GenericClassDefSymbol *this)

{
  Type *pTVar1;
  ASTContext local_40;
  
  if ((this->defaultSpecialization).super__Optional_base<const_slang::ast::Type_*,_true,_true>.
      _M_payload.super__Optional_payload_base<const_slang::ast::Type_*>._M_engaged == true) {
    pTVar1 = (this->defaultSpecialization).
             super__Optional_base<const_slang::ast::Type_*,_true,_true>._M_payload.
             super__Optional_payload_base<const_slang::ast::Type_*>._M_payload._M_value;
  }
  else {
    local_40.scope.ptr = (this->super_Symbol).parentScope;
    if (local_40.scope.ptr == (Scope *)0x0) {
      assert::assertFailed
                ("scope",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/symbols/ClassSymbols.cpp"
                 ,0x2e2,
                 "const Type *slang::ast::GenericClassDefSymbol::getDefaultSpecialization() const");
    }
    local_40.lookupIndex = 0xffffffff;
    local_40.flags.m_bits = 0;
    local_40.instanceOrProc = (Symbol *)0x0;
    local_40.firstTempVar = (TempVarSymbol *)0x0;
    local_40.randomizeDetails = (RandomizeDetails *)0x0;
    local_40.assertionInstance = (AssertionInstanceDetails *)0x0;
    pTVar1 = getSpecializationImpl
                       (this,&local_40,(this->super_Symbol).location,false,
                        (ParameterValueAssignmentSyntax *)0x0);
    (this->defaultSpecialization).super__Optional_base<const_slang::ast::Type_*,_true,_true>.
    _M_payload.super__Optional_payload_base<const_slang::ast::Type_*>._M_payload._M_value = pTVar1;
    (this->defaultSpecialization).super__Optional_base<const_slang::ast::Type_*,_true,_true>.
    _M_payload.super__Optional_payload_base<const_slang::ast::Type_*>._M_engaged = true;
  }
  return pTVar1;
}

Assistant:

const Type* GenericClassDefSymbol::getDefaultSpecialization() const {
    if (defaultSpecialization)
        return *defaultSpecialization;

    auto scope = getParentScope();
    ASSERT(scope);

    auto result = getSpecializationImpl(ASTContext(*scope, LookupLocation::max), location,
                                        /* forceInvalidParams */ false, nullptr);
    defaultSpecialization = result;
    return result;
}